

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall TPZManVector<long_double,_3>::Shrink(TPZManVector<long_double,_3> *this)

{
  longdouble *plVar1;
  ulong uVar2;
  longdouble *plVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (this->super_TPZVec<long_double>).fNElements;
  if ((long)uVar5 < 4) {
    plVar3 = (this->super_TPZVec<long_double>).fStore;
    plVar1 = this->fExtAlloc;
    if (plVar3 != plVar1) {
      uVar2 = 0;
      if ((long)uVar5 < 1) {
        uVar5 = uVar2;
      }
      while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
        *(unkbyte10 *)((long)plVar1 + uVar2) = *(unkbyte10 *)((long)plVar3 + uVar2);
        uVar2 = uVar2 + 0x10;
      }
      if (plVar3 != (longdouble *)0x0) {
        operator_delete__(plVar3);
      }
      (this->super_TPZVec<long_double>).fStore = plVar1;
      (this->super_TPZVec<long_double>).fNAlloc = 3;
    }
  }
  else if ((this->super_TPZVec<long_double>).fNAlloc != uVar5) {
    lVar4 = 0;
    plVar3 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
    plVar1 = (this->super_TPZVec<long_double>).fStore;
    uVar2 = uVar5;
    while (bVar6 = uVar2 != 0, uVar2 = uVar2 - 1, bVar6) {
      *(unkbyte10 *)((long)plVar3 + lVar4) = *(unkbyte10 *)((long)plVar1 + lVar4);
      lVar4 = lVar4 + 0x10;
    }
    if (plVar1 != (longdouble *)0x0) {
      operator_delete__(plVar1);
      uVar5 = (this->super_TPZVec<long_double>).fNElements;
    }
    (this->super_TPZVec<long_double>).fStore = plVar3;
    (this->super_TPZVec<long_double>).fNAlloc = uVar5;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}